

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

TemplateDictionary * MakeDict1(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  TemplateString TVar23;
  TemplateString TVar24;
  TemplateString TVar25;
  TemplateString TVar26;
  TemplateString TVar27;
  TemplateString TVar28;
  TemplateString TVar29;
  TemplateString TVar30;
  TemplateString TVar31;
  TemplateString TVar32;
  TemplateString TVar33;
  TemplateString TVar34;
  TemplateString TVar35;
  TemplateString TVar36;
  TemplateString TVar37;
  TemplateString TVar38;
  TemplateString TVar39;
  TemplateString TVar40;
  TemplateString TVar41;
  TemplateString TVar42;
  TemplateString TVar43;
  TemplateString TVar44;
  TemplateString TVar45;
  TemplateString TVar46;
  TemplateString TVar47;
  TemplateString TVar48;
  TemplateString TVar49;
  TemplateString TVar50;
  TemplateString TVar51;
  TemplateString TVar52;
  TemplateString TVar53;
  TemplateString TVar54;
  TemplateString TVar55;
  TemplateString TVar56;
  TemplateString TVar57;
  TemplateString TVar58;
  TemplateString TVar59;
  TemplateString TVar60;
  TemplateString TVar61;
  TemplateString TVar62;
  TemplateString TVar63;
  TemplateString TVar64;
  TemplateString TVar65;
  TemplateString TVar66;
  TemplateString TVar67;
  TemplateString TVar68;
  TemplateString TVar69;
  TemplateString TVar70;
  TemplateString TVar71;
  TemplateString TVar72;
  TemplateString TVar73;
  TemplateString TVar74;
  TemplateString TVar75;
  TemplateString TVar76;
  TemplateString TVar77;
  TemplateString TVar78;
  TemplateString TVar79;
  TemplateString TVar80;
  TemplateString TVar81;
  TemplateString TVar82;
  TemplateString TVar83;
  TemplateString TVar84;
  TemplateString TVar85;
  TemplateString TVar86;
  TemplateString TVar87;
  TemplateString TVar88;
  TemplateString TVar89;
  TemplateString TVar90;
  TemplateString TVar91;
  TemplateString TVar92;
  TemplateString TVar93;
  TemplateString TVar94;
  TemplateString TVar95;
  TemplateString TVar96;
  TemplateString TVar97;
  TemplateString TVar98;
  TemplateString TVar99;
  TemplateString TVar100;
  TemplateString TVar101;
  TemplateString TVar102;
  TemplateModifier *pTVar103;
  undefined8 uVar104;
  TemplateDictionary *pTVar105;
  undefined8 in_R9;
  TemplateString local_e20;
  TemplateString local_e00;
  undefined8 local_de0;
  TemplateDictionary *inc_simple;
  size_t local_dd0;
  undefined8 local_dc8;
  TemplateId local_dc0;
  TemplateString local_db8;
  undefined8 local_d98;
  TemplateDictionary *footer_dict;
  size_t local_d88;
  bool local_d80;
  undefined7 uStack_d7f;
  TemplateId local_d78;
  TemplateString local_d70;
  TemplateString local_d50;
  TemplateString local_d30;
  TemplateString local_d10;
  TemplateString local_cf0;
  TemplateString local_cd0;
  TemplateString local_cb0;
  TemplateString local_c90;
  TemplateString local_c70;
  TemplateString local_c50;
  TemplateString local_c30;
  TemplateString local_c10;
  TemplateString local_bf0;
  TemplateString local_bd0;
  TemplateString local_bb0;
  TemplateString local_b90;
  TemplateString local_b70;
  TemplateString local_b50;
  TemplateString local_b30;
  TemplateString local_b10;
  TemplateString local_af0;
  TemplateString local_ad0;
  TemplateString local_ab0;
  TemplateString local_a90;
  TemplateString local_a70;
  TemplateString local_a50;
  TemplateString local_a30;
  TemplateString local_a10;
  TemplateString local_9f0;
  TemplateString local_9d0;
  TemplateString local_9b0;
  TemplateString local_990;
  TemplateString local_970;
  TemplateString local_950;
  char *local_930;
  char *res;
  size_t local_920;
  undefined8 local_918;
  TemplateId local_910;
  TemplateString local_908;
  TemplateModifier *local_8e8;
  TemplateDictionary *result;
  undefined1 auStack_8d8 [4];
  int i;
  size_t local_8d0;
  bool local_8c8;
  undefined7 uStack_8c7;
  TemplateId local_8c0;
  TemplateString local_8b8;
  TemplateString local_898;
  TemplateString local_878;
  TemplateString local_858;
  TemplateString local_838;
  TemplateString local_818;
  TemplateString local_7f8;
  TemplateString local_7d8;
  allocator local_7b1;
  string local_7b0 [32];
  TemplateString local_790;
  TemplateString local_770;
  undefined8 local_750;
  TemplateDictionary *foo;
  size_t sStack_740;
  undefined8 local_738;
  TemplateId TStack_730;
  TemplateString local_728;
  TemplateString local_708;
  TemplateString local_6e8;
  TemplateString local_6c8;
  TemplateString local_6a8;
  TemplateString local_688;
  TemplateString local_668;
  TemplateString local_648;
  undefined8 local_628;
  TemplateDictionary *inc2b;
  size_t sStack_618;
  bool local_610;
  undefined7 uStack_60f;
  TemplateId TStack_608;
  TemplateString local_600;
  TemplateString local_5e0;
  TemplateString local_5c0;
  TemplateString local_5a0;
  TemplateString local_580;
  TemplateString local_560;
  undefined8 local_540;
  TemplateDictionary *inc2a;
  size_t sStack_530;
  undefined8 local_528;
  TemplateId TStack_520;
  undefined8 local_518;
  TemplateDictionary *jfs2;
  size_t sStack_508;
  bool local_500;
  undefined7 uStack_4ff;
  TemplateId TStack_4f8;
  TemplateString local_4f0;
  TemplateString local_4d0;
  TemplateString local_4b0;
  undefined8 local_490;
  TemplateDictionary *inc1c;
  size_t sStack_480;
  undefined8 local_478;
  TemplateId TStack_470;
  TemplateString local_468;
  undefined8 local_448;
  TemplateDictionary *inc1b;
  size_t sStack_438;
  undefined8 local_430;
  TemplateId TStack_428;
  TemplateString local_420;
  undefined8 local_400;
  TemplateDictionary *inc1a;
  size_t sStack_3f0;
  undefined8 local_3e8;
  TemplateId TStack_3e0;
  undefined8 local_3d8;
  TemplateDictionary *jfs1;
  size_t sStack_3c8;
  bool local_3c0;
  undefined7 uStack_3bf;
  TemplateId TStack_3b8;
  allocator local_3a9;
  string local_3a8 [32];
  TemplateString local_388;
  TemplateString local_368;
  TemplateString local_348;
  TemplateString local_328;
  TemplateString local_308;
  TemplateString local_2e8;
  TemplateString local_2c8;
  TemplateString local_2a8;
  TemplateString local_288;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_c8;
  TemplateModifier *local_a8;
  TemplateDictionary *fbt;
  size_t sStack_98;
  bool local_90;
  undefined7 uStack_8f;
  TemplateId TStack_88;
  TemplateString local_80;
  TemplateString local_60;
  TemplateString local_30;
  TemplateDictionary *local_10;
  TemplateDictionary *dict;
  
  pTVar105 = (TemplateDictionary *)operator_new(0x70);
  ctemplate::TemplateString::TemplateString(&local_30,"dict1");
  ctemplate::TemplateDictionary::TemplateDictionary(pTVar105,&local_30,(UnsafeArena *)0x0);
  local_10 = pTVar105;
  ctemplate::TemplateString::TemplateString
            (&local_60,"just used for debugging, so doesn\'t matter.txt");
  TVar1.length_._0_4_ = (int)local_60.length_;
  TVar1.ptr_ = local_60.ptr_;
  TVar1.length_._4_4_ = (int)(local_60.length_ >> 0x20);
  TVar1._16_4_ = local_60._16_4_;
  TVar1._20_4_ = local_60._20_4_;
  TVar1.id_._0_4_ = (int)local_60.id_;
  TVar1.id_._4_4_ = (int)(local_60.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar1);
  ctemplate::TemplateString::TemplateString(&local_80,"HEAD");
  ctemplate::TemplateString::TemplateString((TemplateString *)&fbt,"   This is the head   ");
  TVar2.length_._0_4_ = (int)local_80.length_;
  TVar2.ptr_ = local_80.ptr_;
  TVar2.length_._4_4_ = (int)(local_80.length_ >> 0x20);
  TVar2._16_4_ = local_80._16_4_;
  TVar2._20_4_ = local_80._20_4_;
  TVar2.id_._0_4_ = (int)local_80.id_;
  TVar2.id_._4_4_ = (int)(local_80.id_ >> 0x20);
  TVar66.length_ = sStack_98;
  TVar66.ptr_ = (char *)fbt;
  TVar66.is_immutable_ = local_90;
  TVar66._17_7_ = uStack_8f;
  TVar66.id_ = TStack_88;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar66);
  ctemplate::TemplateString::TemplateString(&local_c8,"FOOTER_BAR_TEXT");
  TVar3.length_._0_4_ = (int)local_c8.length_;
  TVar3.ptr_ = local_c8.ptr_;
  TVar3.length_._4_4_ = (int)(local_c8.length_ >> 0x20);
  TVar3._16_4_ = local_c8._16_4_;
  TVar3._20_4_ = local_c8._20_4_;
  TVar3.id_._0_4_ = (int)local_c8.id_;
  TVar3.id_._4_4_ = (int)(local_c8.id_ >> 0x20);
  local_a8 = (TemplateModifier *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
  ctemplate::TemplateString::TemplateString(&local_e8,"BODY");
  ctemplate::TemplateString::TemplateString(&local_108,"Should never be shown");
  TVar4.length_._0_4_ = (int)local_e8.length_;
  TVar4.ptr_ = local_e8.ptr_;
  TVar4.length_._4_4_ = (int)(local_e8.length_ >> 0x20);
  TVar4._16_4_ = local_e8._16_4_;
  TVar4._20_4_ = local_e8._20_4_;
  TVar4.id_._0_4_ = (int)local_e8.id_;
  TVar4.id_._4_4_ = (int)(local_e8.id_ >> 0x20);
  TVar67.length_ = local_108.length_;
  TVar67.ptr_ = local_108.ptr_;
  TVar67.is_immutable_ = local_108.is_immutable_;
  TVar67._17_7_ = local_108._17_7_;
  TVar67.id_ = local_108.id_;
  ctemplate::TemplateDictionary::SetValue(TVar4,TVar67);
  pTVar103 = local_a8;
  ctemplate::TemplateString::TemplateString(&local_128,"HOME_LINK");
  ctemplate::TemplateString::TemplateString(&local_148,"<b>Time to go home!</b>");
  TVar5.length_._0_4_ = (int)local_128.length_;
  TVar5.ptr_ = local_128.ptr_;
  TVar5.length_._4_4_ = (int)(local_128.length_ >> 0x20);
  TVar5._16_4_ = local_128._16_4_;
  TVar5._20_4_ = local_128._20_4_;
  TVar5.id_._0_4_ = (int)local_128.id_;
  TVar5.id_._4_4_ = (int)(local_128.id_ >> 0x20);
  TVar68.length_ = local_148.length_;
  TVar68.ptr_ = local_148.ptr_;
  TVar68.is_immutable_ = local_148.is_immutable_;
  TVar68._17_7_ = local_148._17_7_;
  TVar68.id_ = local_148.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar68,pTVar103);
  pTVar103 = local_a8;
  ctemplate::TemplateString::TemplateString(&local_168,"ADVERTISE_LINK");
  ctemplate::TemplateDictionary::SetFormattedValue(pTVar103,"<b>Be advertiser #%d</b>",2);
  ctemplate::TemplateString::TemplateString(&local_188,"ABOUT_GOOGLE_LINK");
  ctemplate::TemplateString::TemplateString(&local_1a8,"<A HREF=/>About Google!</A>");
  TVar6.length_._0_4_ = (int)local_188.length_;
  TVar6.ptr_ = local_188.ptr_;
  TVar6.length_._4_4_ = (int)(local_188.length_ >> 0x20);
  TVar6._16_4_ = local_188._16_4_;
  TVar6._20_4_ = local_188._20_4_;
  TVar6.id_._0_4_ = (int)local_188.id_;
  TVar6.id_._4_4_ = (int)(local_188.id_ >> 0x20);
  TVar69.length_ = local_1a8.length_;
  TVar69.ptr_ = local_1a8.ptr_;
  TVar69.is_immutable_ = local_1a8.is_immutable_;
  TVar69._17_7_ = local_1a8._17_7_;
  TVar69.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar6,TVar69);
  ctemplate::TemplateString::TemplateString(&local_1c8,"PROMO_LICENSING_SECTION");
  TVar7.length_._0_4_ = (int)local_1c8.length_;
  TVar7.ptr_ = local_1c8.ptr_;
  TVar7.length_._4_4_ = (int)(local_1c8.length_ >> 0x20);
  TVar7._16_4_ = local_1c8._16_4_;
  TVar7._20_4_ = local_1c8._20_4_;
  TVar7.id_._0_4_ = (int)local_1c8.id_;
  TVar7.id_._4_4_ = (int)(local_1c8.id_ >> 0x20);
  ctemplate::TemplateDictionary::ShowSection(TVar7);
  ctemplate::TemplateString::TemplateString(&local_1e8,"PROMO_LICENSING_LINK");
  ctemplate::TemplateString::TemplateString(&local_208,"<A HREF=\'foo\'>");
  TVar8.length_._0_4_ = (int)local_1e8.length_;
  TVar8.ptr_ = local_1e8.ptr_;
  TVar8.length_._4_4_ = (int)(local_1e8.length_ >> 0x20);
  TVar8._16_4_ = local_1e8._16_4_;
  TVar8._20_4_ = local_1e8._20_4_;
  TVar8.id_._0_4_ = (int)local_1e8.id_;
  TVar8.id_._4_4_ = (int)(local_1e8.id_ >> 0x20);
  TVar70.length_ = local_208.length_;
  TVar70.ptr_ = local_208.ptr_;
  TVar70.is_immutable_ = local_208.is_immutable_;
  TVar70._17_7_ = local_208._17_7_;
  TVar70.id_ = local_208.id_;
  ctemplate::TemplateDictionary::SetValue(TVar8,TVar70);
  ctemplate::TemplateString::TemplateString(&local_228,"TRIM_LINE_COLOR");
  ctemplate::TemplateString::TemplateString(&local_248,"Who cares?");
  TVar9.length_._0_4_ = (int)local_228.length_;
  TVar9.ptr_ = local_228.ptr_;
  TVar9.length_._4_4_ = (int)(local_228.length_ >> 0x20);
  TVar9._16_4_ = local_228._16_4_;
  TVar9._20_4_ = local_228._20_4_;
  TVar9.id_._0_4_ = (int)local_228.id_;
  TVar9.id_._4_4_ = (int)(local_228.id_ >> 0x20);
  TVar71.length_ = local_248.length_;
  TVar71.ptr_ = local_248.ptr_;
  TVar71.is_immutable_ = local_248.is_immutable_;
  TVar71._17_7_ = local_248._17_7_;
  TVar71.id_ = local_248.id_;
  ctemplate::TemplateDictionary::SetValue(TVar9,TVar71);
  pTVar105 = local_10;
  ctemplate::TemplateString::TemplateString(&local_268,"TRIM_LINE_HEIGHT");
  TVar10.length_._0_4_ = (int)local_268.length_;
  TVar10.ptr_ = local_268.ptr_;
  TVar10.length_._4_4_ = (int)(local_268.length_ >> 0x20);
  TVar10._16_4_ = local_268._16_4_;
  TVar10._20_4_ = local_268._20_4_;
  TVar10.id_._0_4_ = (int)local_268.id_;
  TVar10.id_._4_4_ = (int)(local_268.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetIntValue(TVar10,(long)pTVar105);
  pTVar105 = local_10;
  ctemplate::TemplateString::TemplateString(&local_288,"MODIFIED_BY_GOOGLE");
  TVar11.length_._0_4_ = (int)local_288.length_;
  TVar11.ptr_ = local_288.ptr_;
  TVar11.length_._4_4_ = (int)(local_288.length_ >> 0x20);
  TVar11._16_4_ = local_288._16_4_;
  TVar11._20_4_ = local_288._20_4_;
  TVar11.id_._0_4_ = (int)local_288.id_;
  TVar11.id_._4_4_ = (int)(local_288.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetIntValue(TVar11,(long)pTVar105);
  ctemplate::TemplateString::TemplateString(&local_2a8,"MSG_copyright");
  ctemplate::TemplateString::TemplateString(&local_2c8,"&copy; Google Inc. (all rights reserved)");
  TVar12.length_._0_4_ = (int)local_2a8.length_;
  TVar12.ptr_ = local_2a8.ptr_;
  TVar12.length_._4_4_ = (int)(local_2a8.length_ >> 0x20);
  TVar12._16_4_ = local_2a8._16_4_;
  TVar12._20_4_ = local_2a8._20_4_;
  TVar12.id_._0_4_ = (int)local_2a8.id_;
  TVar12.id_._4_4_ = (int)(local_2a8.id_ >> 0x20);
  TVar72.length_ = local_2c8.length_;
  TVar72.ptr_ = local_2c8.ptr_;
  TVar72.is_immutable_ = local_2c8.is_immutable_;
  TVar72._17_7_ = local_2c8._17_7_;
  TVar72.id_ = local_2c8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar12,TVar72);
  ctemplate::TemplateString::TemplateString(&local_2e8,"CLOSING_DIV_SECTION");
  TVar13.length_._0_4_ = (int)local_2e8.length_;
  TVar13.ptr_ = local_2e8.ptr_;
  TVar13.length_._4_4_ = (int)(local_2e8.length_ >> 0x20);
  TVar13._16_4_ = local_2e8._16_4_;
  TVar13._20_4_ = local_2e8._20_4_;
  TVar13.id_._0_4_ = (int)local_2e8.id_;
  TVar13.id_._4_4_ = (int)(local_2e8.id_ >> 0x20);
  ctemplate::TemplateDictionary::ShowSection(TVar13);
  ctemplate::TemplateString::TemplateString(&local_308,"LATENCY_PREFETCH_URL");
  ctemplate::TemplateString::TemplateString(&local_328,"/huh?");
  ctemplate::TemplateString::TemplateString(&local_348,"UNUSED_SECTION_NAME");
  TVar14.length_._0_4_ = (int)local_308.length_;
  TVar14.ptr_ = local_308.ptr_;
  TVar14.length_._4_4_ = (int)(local_308.length_ >> 0x20);
  TVar14._16_4_ = local_308._16_4_;
  TVar14._20_4_ = local_308._20_4_;
  TVar14.id_._0_4_ = (int)local_308.id_;
  TVar14.id_._4_4_ = (int)(local_308.id_ >> 0x20);
  TVar73.length_ = local_328.length_;
  TVar73.ptr_ = local_328.ptr_;
  TVar73.is_immutable_ = local_328.is_immutable_;
  TVar73._17_7_ = local_328._17_7_;
  TVar73.id_ = local_328.id_;
  TVar100.length_ = local_348.length_;
  TVar100.ptr_ = local_348.ptr_;
  TVar100.is_immutable_ = local_348.is_immutable_;
  TVar100._17_7_ = local_348._17_7_;
  TVar100.id_ = local_348.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar14,TVar73,TVar100);
  ctemplate::TemplateString::TemplateString(&local_368,"LATENCY_PREFETCH_URL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"/latency",&local_3a9);
  ctemplate::TemplateString::TemplateString(&local_388,(string *)local_3a8);
  ctemplate::TemplateString::TemplateString((TemplateString *)&jfs1,"LATENCY_PREFETCH");
  TVar15.length_._0_4_ = (int)local_368.length_;
  TVar15.ptr_ = local_368.ptr_;
  TVar15.length_._4_4_ = (int)(local_368.length_ >> 0x20);
  TVar15._16_4_ = local_368._16_4_;
  TVar15._20_4_ = local_368._20_4_;
  TVar15.id_._0_4_ = (int)local_368.id_;
  TVar15.id_._4_4_ = (int)(local_368.id_ >> 0x20);
  TVar74.length_ = local_388.length_;
  TVar74.ptr_ = local_388.ptr_;
  TVar74.is_immutable_ = local_388.is_immutable_;
  TVar74._17_7_ = local_388._17_7_;
  TVar74.id_ = local_388.id_;
  TVar101.length_ = sStack_3c8;
  TVar101.ptr_ = (char *)jfs1;
  TVar101.is_immutable_ = local_3c0;
  TVar101._17_7_ = uStack_3bf;
  TVar101.id_ = TStack_3b8;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar15,TVar74,TVar101);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  ctemplate::TemplateString::TemplateString((TemplateString *)&inc1a,"JAVASCRIPT_FOOTER_SECTION");
  TVar16.length_._0_4_ = (int)sStack_3f0;
  TVar16.ptr_ = (char *)inc1a;
  TVar16.length_._4_4_ = (int)(sStack_3f0 >> 0x20);
  TVar16._16_4_ = (int)local_3e8;
  TVar16._20_4_ = SUB84(local_3e8,4);
  TVar16.id_._0_4_ = (int)TStack_3e0;
  TVar16.id_._4_4_ = (int)(TStack_3e0 >> 0x20);
  local_3d8 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar16);
  ctemplate::TemplateString::TemplateString(&local_420,"FAST_NEXT_JAVASCRIPT");
  TVar17.length_._0_4_ = (int)local_420.length_;
  TVar17.ptr_ = local_420.ptr_;
  TVar17.length_._4_4_ = (int)(local_420.length_ >> 0x20);
  TVar17._16_4_ = local_420._16_4_;
  TVar17._20_4_ = local_420._20_4_;
  TVar17.id_._0_4_ = (int)local_420.id_;
  TVar17.id_._4_4_ = (int)(local_420.id_ >> 0x20);
  local_400 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar17);
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&inc1b,"template_unittest_test_simple.in");
  TVar18.length_._0_4_ = (int)sStack_438;
  TVar18.ptr_ = (char *)inc1b;
  TVar18.length_._4_4_ = (int)(sStack_438 >> 0x20);
  TVar18._16_4_ = (int)local_430;
  TVar18._20_4_ = SUB84(local_430,4);
  TVar18.id_._0_4_ = (int)TStack_428;
  TVar18.id_._4_4_ = (int)(TStack_428 >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar18);
  ctemplate::TemplateString::TemplateString(&local_468,"FAST_NEXT_JAVASCRIPT");
  TVar19.length_._0_4_ = (int)local_468.length_;
  TVar19.ptr_ = local_468.ptr_;
  TVar19.length_._4_4_ = (int)(local_468.length_ >> 0x20);
  TVar19._16_4_ = local_468._16_4_;
  TVar19._20_4_ = local_468._20_4_;
  TVar19.id_._0_4_ = (int)local_468.id_;
  TVar19.id_._4_4_ = (int)(local_468.id_ >> 0x20);
  local_448 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar19);
  ctemplate::TemplateString::TemplateString((TemplateString *)&inc1c,INVALID1_FN);
  TVar20.length_._0_4_ = (int)sStack_480;
  TVar20.ptr_ = (char *)inc1c;
  TVar20.length_._4_4_ = (int)(sStack_480 >> 0x20);
  TVar20._16_4_ = (int)local_478;
  TVar20._20_4_ = SUB84(local_478,4);
  TVar20.id_._0_4_ = (int)TStack_470;
  TVar20.id_._4_4_ = (int)(TStack_470 >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar20);
  ctemplate::TemplateString::TemplateString(&local_4b0,"FAST_NEXT_JAVASCRIPT");
  TVar21.length_._0_4_ = (int)local_4b0.length_;
  TVar21.ptr_ = local_4b0.ptr_;
  TVar21.length_._4_4_ = (int)(local_4b0.length_ >> 0x20);
  TVar21._16_4_ = local_4b0._16_4_;
  TVar21._20_4_ = local_4b0._20_4_;
  TVar21.id_._0_4_ = (int)local_4b0.id_;
  TVar21.id_._4_4_ = (int)(local_4b0.id_ >> 0x20);
  local_490 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar21);
  ctemplate::TemplateString::TemplateString(&local_4d0,"template_unittest_test_simple.in");
  TVar22.length_._0_4_ = (int)local_4d0.length_;
  TVar22.ptr_ = local_4d0.ptr_;
  TVar22.length_._4_4_ = (int)(local_4d0.length_ >> 0x20);
  TVar22._16_4_ = local_4d0._16_4_;
  TVar22._20_4_ = local_4d0._20_4_;
  TVar22.id_._0_4_ = (int)local_4d0.id_;
  TVar22.id_._4_4_ = (int)(local_4d0.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar22);
  ctemplate::TemplateString::TemplateString(&local_4f0,"HEAD");
  ctemplate::TemplateString::TemplateString((TemplateString *)&jfs2,"head");
  TVar23.length_._0_4_ = (int)local_4f0.length_;
  TVar23.ptr_ = local_4f0.ptr_;
  TVar23.length_._4_4_ = (int)(local_4f0.length_ >> 0x20);
  TVar23._16_4_ = local_4f0._16_4_;
  TVar23._20_4_ = local_4f0._20_4_;
  TVar23.id_._0_4_ = (int)local_4f0.id_;
  TVar23.id_._4_4_ = (int)(local_4f0.id_ >> 0x20);
  TVar75.length_ = sStack_508;
  TVar75.ptr_ = (char *)jfs2;
  TVar75.is_immutable_ = local_500;
  TVar75._17_7_ = uStack_4ff;
  TVar75.id_ = TStack_4f8;
  ctemplate::TemplateDictionary::SetValue(TVar23,TVar75);
  ctemplate::TemplateString::TemplateString((TemplateString *)&inc2a,"JAVASCRIPT_FOOTER_SECTION");
  TVar24.length_._0_4_ = (int)sStack_530;
  TVar24.ptr_ = (char *)inc2a;
  TVar24.length_._4_4_ = (int)(sStack_530 >> 0x20);
  TVar24._16_4_ = (int)local_528;
  TVar24._20_4_ = SUB84(local_528,4);
  TVar24.id_._0_4_ = (int)TStack_520;
  TVar24.id_._4_4_ = (int)(TStack_520 >> 0x20);
  local_518 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar24);
  ctemplate::TemplateString::TemplateString(&local_560,"FAST_NEXT_JAVASCRIPT");
  TVar25.length_._0_4_ = (int)local_560.length_;
  TVar25.ptr_ = local_560.ptr_;
  TVar25.length_._4_4_ = (int)(local_560.length_ >> 0x20);
  TVar25._16_4_ = local_560._16_4_;
  TVar25._20_4_ = local_560._20_4_;
  TVar25.id_._0_4_ = (int)local_560.id_;
  TVar25.id_._4_4_ = (int)(local_560.id_ >> 0x20);
  local_540 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar25);
  ctemplate::TemplateString::TemplateString(&local_580,"template_unittest_test_simple.in");
  TVar26.length_._0_4_ = (int)local_580.length_;
  TVar26.ptr_ = local_580.ptr_;
  TVar26.length_._4_4_ = (int)(local_580.length_ >> 0x20);
  TVar26._16_4_ = local_580._16_4_;
  TVar26._20_4_ = local_580._20_4_;
  TVar26.id_._0_4_ = (int)local_580.id_;
  TVar26.id_._4_4_ = (int)(local_580.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar26);
  ctemplate::TemplateString::TemplateString(&local_5a0,"HEAD");
  ctemplate::TemplateString::TemplateString(&local_5c0,"include-head");
  TVar27.length_._0_4_ = (int)local_5a0.length_;
  TVar27.ptr_ = local_5a0.ptr_;
  TVar27.length_._4_4_ = (int)(local_5a0.length_ >> 0x20);
  TVar27._16_4_ = local_5a0._16_4_;
  TVar27._20_4_ = local_5a0._20_4_;
  TVar27.id_._0_4_ = (int)local_5a0.id_;
  TVar27.id_._4_4_ = (int)(local_5a0.id_ >> 0x20);
  TVar76.length_ = local_5c0.length_;
  TVar76.ptr_ = local_5c0.ptr_;
  TVar76.is_immutable_ = local_5c0.is_immutable_;
  TVar76._17_7_ = local_5c0._17_7_;
  TVar76.id_ = local_5c0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar27,TVar76);
  uVar104 = local_540;
  ctemplate::TemplateString::TemplateString(&local_5e0,"BODY");
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (uVar104,(TemplateModifier *)&ctemplate::html_escape,0x55555555,"<b>%s</b>: %.4f",
             "<A HREF=/>");
  ctemplate::TemplateString::TemplateString(&local_600,"BI_NEWLINE");
  ctemplate::TemplateString::TemplateString((TemplateString *)&inc2b,"");
  TVar28.length_._0_4_ = (int)local_600.length_;
  TVar28.ptr_ = local_600.ptr_;
  TVar28.length_._4_4_ = (int)(local_600.length_ >> 0x20);
  TVar28._16_4_ = local_600._16_4_;
  TVar28._20_4_ = local_600._20_4_;
  TVar28.id_._0_4_ = (int)local_600.id_;
  TVar28.id_._4_4_ = (int)(local_600.id_ >> 0x20);
  TVar77.length_ = sStack_618;
  TVar77.ptr_ = (char *)inc2b;
  TVar77.is_immutable_ = local_610;
  TVar77._17_7_ = uStack_60f;
  TVar77.id_ = TStack_608;
  ctemplate::TemplateDictionary::SetValue(TVar28,TVar77);
  ctemplate::TemplateString::TemplateString(&local_648,"FAST_NEXT_JAVASCRIPT");
  TVar29.length_._0_4_ = (int)local_648.length_;
  TVar29.ptr_ = local_648.ptr_;
  TVar29.length_._4_4_ = (int)(local_648.length_ >> 0x20);
  TVar29._16_4_ = local_648._16_4_;
  TVar29._20_4_ = local_648._20_4_;
  TVar29.id_._0_4_ = (int)local_648.id_;
  TVar29.id_._4_4_ = (int)(local_648.id_ >> 0x20);
  local_628 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar29);
  ctemplate::TemplateString::TemplateString(&local_668,"template_unittest_test_html.in");
  TVar30.length_._0_4_ = (int)local_668.length_;
  TVar30.ptr_ = local_668.ptr_;
  TVar30.length_._4_4_ = (int)(local_668.length_ >> 0x20);
  TVar30._16_4_ = local_668._16_4_;
  TVar30._20_4_ = local_668._20_4_;
  TVar30.id_._0_4_ = (int)local_668.id_;
  TVar30.id_._4_4_ = (int)(local_668.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar30);
  ctemplate::TemplateString::TemplateString(&local_688,"HEAD");
  ctemplate::TemplateString::TemplateString(&local_6a8,"should be ignored");
  TVar31.length_._0_4_ = (int)local_688.length_;
  TVar31.ptr_ = local_688.ptr_;
  TVar31.length_._4_4_ = (int)(local_688.length_ >> 0x20);
  TVar31._16_4_ = local_688._16_4_;
  TVar31._20_4_ = local_688._20_4_;
  TVar31.id_._0_4_ = (int)local_688.id_;
  TVar31.id_._4_4_ = (int)(local_688.id_ >> 0x20);
  TVar78.length_ = local_6a8.length_;
  TVar78.ptr_ = local_6a8.ptr_;
  TVar78.is_immutable_ = local_6a8.is_immutable_;
  TVar78._17_7_ = local_6a8._17_7_;
  TVar78.id_ = local_6a8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar31,TVar78);
  ctemplate::TemplateString::TemplateString(&local_6c8,"FAST_NEXT_JAVASCRIPT");
  TVar32.length_._0_4_ = (int)local_6c8.length_;
  TVar32.ptr_ = local_6c8.ptr_;
  TVar32.length_._4_4_ = (int)(local_6c8.length_ >> 0x20);
  TVar32._16_4_ = local_6c8._16_4_;
  TVar32._20_4_ = local_6c8._20_4_;
  TVar32.id_._0_4_ = (int)local_6c8.id_;
  TVar32.id_._4_4_ = (int)(local_6c8.id_ >> 0x20);
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar32);
  ctemplate::TemplateString::TemplateString(&local_6e8,"DUMMY");
  ctemplate::TemplateString::TemplateString(&local_708,"");
  ctemplate::TemplateString::TemplateString(&local_728,"NO_MOUSEOVER_FUNCTIONS");
  TVar33.length_._0_4_ = (int)local_6e8.length_;
  TVar33.ptr_ = local_6e8.ptr_;
  TVar33.length_._4_4_ = (int)(local_6e8.length_ >> 0x20);
  TVar33._16_4_ = local_6e8._16_4_;
  TVar33._20_4_ = local_6e8._20_4_;
  TVar33.id_._0_4_ = (int)local_6e8.id_;
  TVar33.id_._4_4_ = (int)(local_6e8.id_ >> 0x20);
  TVar79.length_ = local_708.length_;
  TVar79.ptr_ = local_708.ptr_;
  TVar79.is_immutable_ = local_708.is_immutable_;
  TVar79._17_7_ = local_708._17_7_;
  TVar79.id_ = local_708.id_;
  TVar102.length_ = local_728.length_;
  TVar102.ptr_ = local_728.ptr_;
  TVar102.is_immutable_ = local_728.is_immutable_;
  TVar102._17_7_ = local_728._17_7_;
  TVar102.id_ = local_728.id_;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar33,TVar79,TVar102);
  ctemplate::TemplateString::TemplateString((TemplateString *)&foo,"MOUSEOVER_FUNCTIONS");
  TVar34.length_._0_4_ = (int)sStack_740;
  TVar34.ptr_ = (char *)foo;
  TVar34.length_._4_4_ = (int)(sStack_740 >> 0x20);
  TVar34._16_4_ = (int)local_738;
  TVar34._20_4_ = SUB84(local_738,4);
  TVar34.id_._0_4_ = (int)TStack_730;
  TVar34.id_._4_4_ = (int)(TStack_730 >> 0x20);
  ctemplate::TemplateDictionary::ShowSection(TVar34);
  ctemplate::TemplateString::TemplateString(&local_770,"MOUSEOVER_JAVASCRIPT");
  TVar35.length_._0_4_ = (int)local_770.length_;
  TVar35.ptr_ = local_770.ptr_;
  TVar35.length_._4_4_ = (int)(local_770.length_ >> 0x20);
  TVar35._16_4_ = local_770._16_4_;
  TVar35._20_4_ = local_770._20_4_;
  TVar35.id_._0_4_ = (int)local_770.id_;
  TVar35.id_._4_4_ = (int)(local_770.id_ >> 0x20);
  local_750 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"not_a_template",&local_7b1);
  ctemplate::TemplateString::TemplateString(&local_790,(string *)local_7b0);
  TVar36.length_._0_4_ = (int)local_790.length_;
  TVar36.ptr_ = local_790.ptr_;
  TVar36.length_._4_4_ = (int)(local_790.length_ >> 0x20);
  TVar36._16_4_ = local_790._16_4_;
  TVar36._20_4_ = local_790._20_4_;
  TVar36.id_._0_4_ = (int)local_790.id_;
  TVar36.id_._4_4_ = (int)(local_790.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar36);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  ctemplate::TemplateString::TemplateString(&local_7d8,"BI_NEWLINE");
  ctemplate::TemplateString::TemplateString(&local_7f8,"not gonna matter");
  TVar37.length_._0_4_ = (int)local_7d8.length_;
  TVar37.ptr_ = local_7d8.ptr_;
  TVar37.length_._4_4_ = (int)(local_7d8.length_ >> 0x20);
  TVar37._16_4_ = local_7d8._16_4_;
  TVar37._20_4_ = local_7d8._20_4_;
  TVar37.id_._0_4_ = (int)local_7d8.id_;
  TVar37.id_._4_4_ = (int)(local_7d8.id_ >> 0x20);
  TVar80.length_ = local_7f8.length_;
  TVar80.ptr_ = local_7f8.ptr_;
  TVar80.is_immutable_ = local_7f8.is_immutable_;
  TVar80._17_7_ = local_7f8._17_7_;
  TVar80.id_ = local_7f8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar37,TVar80);
  pTVar105 = local_10;
  ctemplate::TemplateString::TemplateString(&local_818,"GOTO_MESSAGE");
  ctemplate::TemplateString::TemplateString(&local_838,"print \"Go home\"");
  TVar38.length_._0_4_ = (int)local_818.length_;
  TVar38.ptr_ = local_818.ptr_;
  TVar38.length_._4_4_ = (int)(local_818.length_ >> 0x20);
  TVar38._16_4_ = local_818._16_4_;
  TVar38._20_4_ = local_818._20_4_;
  TVar38.id_._0_4_ = (int)local_818.id_;
  TVar38.id_._4_4_ = (int)(local_818.id_ >> 0x20);
  TVar81.length_ = local_838.length_;
  TVar81.ptr_ = local_838.ptr_;
  TVar81.is_immutable_ = local_838.is_immutable_;
  TVar81._17_7_ = local_838._17_7_;
  TVar81.id_ = local_838.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar38,TVar81,(TemplateModifier *)pTVar105);
  pTVar105 = local_10;
  ctemplate::TemplateString::TemplateString(&local_858,"UPDATE");
  ctemplate::TemplateString::TemplateString(&local_878,"monday & tuesday");
  TVar39.length_._0_4_ = (int)local_858.length_;
  TVar39.ptr_ = local_858.ptr_;
  TVar39.length_._4_4_ = (int)(local_858.length_ >> 0x20);
  TVar39._16_4_ = local_858._16_4_;
  TVar39._20_4_ = local_858._20_4_;
  TVar39.id_._0_4_ = (int)local_858.id_;
  TVar39.id_._4_4_ = (int)(local_858.id_ >> 0x20);
  TVar82.length_ = local_878.length_;
  TVar82.ptr_ = local_878.ptr_;
  TVar82.is_immutable_ = local_878.is_immutable_;
  TVar82._17_7_ = local_878._17_7_;
  TVar82.id_ = local_878.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar39,TVar82,(TemplateModifier *)pTVar105);
  ctemplate::TemplateString::TemplateString(&local_898,"UPDATE_SECTION");
  TVar40.length_._0_4_ = (int)local_898.length_;
  TVar40.ptr_ = local_898.ptr_;
  TVar40.length_._4_4_ = (int)(local_898.length_ >> 0x20);
  TVar40._16_4_ = local_898._16_4_;
  TVar40._20_4_ = local_898._20_4_;
  TVar40.id_._0_4_ = (int)local_898.id_;
  TVar40.id_._4_4_ = (int)(local_898.id_ >> 0x20);
  ctemplate::TemplateDictionary::ShowSection(TVar40);
  ctemplate::TemplateString::TemplateString(&local_8b8,"ALIGNMENT");
  ctemplate::TemplateString::TemplateString((TemplateString *)auStack_8d8,"\"right\"");
  TVar41.length_._0_4_ = (int)local_8b8.length_;
  TVar41.ptr_ = local_8b8.ptr_;
  TVar41.length_._4_4_ = (int)(local_8b8.length_ >> 0x20);
  TVar41._16_4_ = local_8b8._16_4_;
  TVar41._20_4_ = local_8b8._20_4_;
  TVar41.id_._0_4_ = (int)local_8b8.id_;
  TVar41.id_._4_4_ = (int)(local_8b8.id_ >> 0x20);
  TVar83.length_ = local_8d0;
  TVar83.ptr_ = _auStack_8d8;
  TVar83.is_immutable_ = local_8c8;
  TVar83._17_7_ = uStack_8c7;
  TVar83.id_ = local_8c0;
  ctemplate::TemplateDictionary::SetValue(TVar41,TVar83);
  for (result._4_4_ = 0; (int)result._4_4_ < 3; result._4_4_ = result._4_4_ + 1) {
    ctemplate::TemplateString::TemplateString(&local_908,"RESULTS");
    TVar42.length_._0_4_ = (int)local_908.length_;
    TVar42.ptr_ = local_908.ptr_;
    TVar42.length_._4_4_ = (int)(local_908.length_ >> 0x20);
    TVar42._16_4_ = local_908._16_4_;
    TVar42._20_4_ = local_908._20_4_;
    TVar42.id_._0_4_ = (int)local_908.id_;
    TVar42.id_._4_4_ = (int)(local_908.id_ >> 0x20);
    local_8e8 = (TemplateModifier *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar42);
    if ((int)result._4_4_ % 2 == 0) {
      ctemplate::TemplateString::TemplateString((TemplateString *)&res,"WHITE_BG");
      TVar43.length_._0_4_ = (int)local_920;
      TVar43.ptr_ = res;
      TVar43.length_._4_4_ = (int)(local_920 >> 0x20);
      TVar43._16_4_ = (int)local_918;
      TVar43._20_4_ = SUB84(local_918,4);
      TVar43.id_._0_4_ = (int)local_910;
      TVar43.id_._4_4_ = (int)(local_910 >> 0x20);
      ctemplate::TemplateDictionary::ShowSection(TVar43);
    }
    pTVar103 = local_8e8;
    local_930 = "<&>\"result\" #%d\'&\'";
    ctemplate::TemplateString::TemplateString(&local_950,"RESULT");
    ctemplate::TemplateDictionary::SetFormattedValue(pTVar103,local_930,(ulong)result._4_4_);
    pTVar103 = local_8e8;
    ctemplate::TemplateString::TemplateString(&local_970,"XML_RESULT");
    TVar44.length_._0_4_ = (int)local_970.length_;
    TVar44.ptr_ = local_970.ptr_;
    TVar44.length_._4_4_ = (int)(local_970.length_ >> 0x20);
    TVar44._16_4_ = local_970._16_4_;
    TVar44._20_4_ = local_970._20_4_;
    TVar44.id_._0_4_ = (int)local_970.id_;
    TVar44.id_._4_4_ = (int)(local_970.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetEscapedFormattedValue
              (TVar44,pTVar103,(char *)&ctemplate::xml_escape,local_930,(ulong)result._4_4_,
               local_970._16_8_,in_R9);
    pTVar103 = local_8e8;
    ctemplate::TemplateString::TemplateString(&local_990,"GOODNESS");
    TVar45.length_._0_4_ = (int)local_990.length_;
    TVar45.ptr_ = local_990.ptr_;
    TVar45.length_._4_4_ = (int)(local_990.length_ >> 0x20);
    TVar45._16_4_ = local_990._16_4_;
    TVar45._20_4_ = local_990._20_4_;
    TVar45.id_._0_4_ = (int)local_990.id_;
    TVar45.id_._4_4_ = (int)(local_990.id_ >> 0x20);
    ctemplate::TemplateDictionary::SetIntValue(TVar45,(long)pTVar103);
  }
  ctemplate::TemplateString::TemplateString(&local_9b0,"AE_TITLE_GOOD");
  ctemplate::TemplateString::TemplateString(&local_9d0,"Hello World!");
  TVar46.length_._0_4_ = (int)local_9b0.length_;
  TVar46.ptr_ = local_9b0.ptr_;
  TVar46.length_._4_4_ = (int)(local_9b0.length_ >> 0x20);
  TVar46._16_4_ = local_9b0._16_4_;
  TVar46._20_4_ = local_9b0._20_4_;
  TVar46.id_._0_4_ = (int)local_9b0.id_;
  TVar46.id_._4_4_ = (int)(local_9b0.id_ >> 0x20);
  TVar84.length_ = local_9d0.length_;
  TVar84.ptr_ = local_9d0.ptr_;
  TVar84.is_immutable_ = local_9d0.is_immutable_;
  TVar84._17_7_ = local_9d0._17_7_;
  TVar84.id_ = local_9d0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar46,TVar84);
  ctemplate::TemplateString::TemplateString(&local_9f0,"AE_TITLE_BAD");
  ctemplate::TemplateString::TemplateString(&local_a10,"Hello <script>alert(1)</script> World!");
  TVar47.length_._0_4_ = (int)local_9f0.length_;
  TVar47.ptr_ = local_9f0.ptr_;
  TVar47.length_._4_4_ = (int)(local_9f0.length_ >> 0x20);
  TVar47._16_4_ = local_9f0._16_4_;
  TVar47._20_4_ = local_9f0._20_4_;
  TVar47.id_._0_4_ = (int)local_9f0.id_;
  TVar47.id_._4_4_ = (int)(local_9f0.id_ >> 0x20);
  TVar85.length_ = local_a10.length_;
  TVar85.ptr_ = local_a10.ptr_;
  TVar85.is_immutable_ = local_a10.is_immutable_;
  TVar85._17_7_ = local_a10._17_7_;
  TVar85.id_ = local_a10.id_;
  ctemplate::TemplateDictionary::SetValue(TVar47,TVar85);
  ctemplate::TemplateString::TemplateString(&local_a30,"AE_URL_GOOD");
  ctemplate::TemplateString::TemplateString(&local_a50,"http://www.google.com/");
  TVar48.length_._0_4_ = (int)local_a30.length_;
  TVar48.ptr_ = local_a30.ptr_;
  TVar48.length_._4_4_ = (int)(local_a30.length_ >> 0x20);
  TVar48._16_4_ = local_a30._16_4_;
  TVar48._20_4_ = local_a30._20_4_;
  TVar48.id_._0_4_ = (int)local_a30.id_;
  TVar48.id_._4_4_ = (int)(local_a30.id_ >> 0x20);
  TVar86.length_ = local_a50.length_;
  TVar86.ptr_ = local_a50.ptr_;
  TVar86.is_immutable_ = local_a50.is_immutable_;
  TVar86._17_7_ = local_a50._17_7_;
  TVar86.id_ = local_a50.id_;
  ctemplate::TemplateDictionary::SetValue(TVar48,TVar86);
  ctemplate::TemplateString::TemplateString(&local_a70,"AE_URL_BAD");
  ctemplate::TemplateString::TemplateString(&local_a90,"javascript:alert(1)");
  TVar49.length_._0_4_ = (int)local_a70.length_;
  TVar49.ptr_ = local_a70.ptr_;
  TVar49.length_._4_4_ = (int)(local_a70.length_ >> 0x20);
  TVar49._16_4_ = local_a70._16_4_;
  TVar49._20_4_ = local_a70._20_4_;
  TVar49.id_._0_4_ = (int)local_a70.id_;
  TVar49.id_._4_4_ = (int)(local_a70.id_ >> 0x20);
  TVar87.length_ = local_a90.length_;
  TVar87.ptr_ = local_a90.ptr_;
  TVar87.is_immutable_ = local_a90.is_immutable_;
  TVar87._17_7_ = local_a90._17_7_;
  TVar87.id_ = local_a90.id_;
  ctemplate::TemplateDictionary::SetValue(TVar49,TVar87);
  ctemplate::TemplateString::TemplateString(&local_ab0,"AE_BG_COLOR_GOOD");
  ctemplate::TemplateString::TemplateString(&local_ad0,"red");
  TVar50.length_._0_4_ = (int)local_ab0.length_;
  TVar50.ptr_ = local_ab0.ptr_;
  TVar50.length_._4_4_ = (int)(local_ab0.length_ >> 0x20);
  TVar50._16_4_ = local_ab0._16_4_;
  TVar50._20_4_ = local_ab0._20_4_;
  TVar50.id_._0_4_ = (int)local_ab0.id_;
  TVar50.id_._4_4_ = (int)(local_ab0.id_ >> 0x20);
  TVar88.length_ = local_ad0.length_;
  TVar88.ptr_ = local_ad0.ptr_;
  TVar88.is_immutable_ = local_ad0.is_immutable_;
  TVar88._17_7_ = local_ad0._17_7_;
  TVar88.id_ = local_ad0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar50,TVar88);
  ctemplate::TemplateString::TemplateString(&local_af0,"AE_BG_COLOR_BAD");
  ctemplate::TemplateString::TemplateString(&local_b10,"evil! &");
  TVar51.length_._0_4_ = (int)local_af0.length_;
  TVar51.ptr_ = local_af0.ptr_;
  TVar51.length_._4_4_ = (int)(local_af0.length_ >> 0x20);
  TVar51._16_4_ = local_af0._16_4_;
  TVar51._20_4_ = local_af0._20_4_;
  TVar51.id_._0_4_ = (int)local_af0.id_;
  TVar51.id_._4_4_ = (int)(local_af0.id_ >> 0x20);
  TVar89.length_ = local_b10.length_;
  TVar89.ptr_ = local_b10.ptr_;
  TVar89.is_immutable_ = local_b10.is_immutable_;
  TVar89._17_7_ = local_b10._17_7_;
  TVar89.id_ = local_b10.id_;
  ctemplate::TemplateDictionary::SetValue(TVar51,TVar89);
  ctemplate::TemplateString::TemplateString(&local_b30,"AE_JS_GOOD");
  ctemplate::TemplateString::TemplateString(&local_b50,"your text here");
  TVar52.length_._0_4_ = (int)local_b30.length_;
  TVar52.ptr_ = local_b30.ptr_;
  TVar52.length_._4_4_ = (int)(local_b30.length_ >> 0x20);
  TVar52._16_4_ = local_b30._16_4_;
  TVar52._20_4_ = local_b30._20_4_;
  TVar52.id_._0_4_ = (int)local_b30.id_;
  TVar52.id_._4_4_ = (int)(local_b30.id_ >> 0x20);
  TVar90.length_ = local_b50.length_;
  TVar90.ptr_ = local_b50.ptr_;
  TVar90.is_immutable_ = local_b50.is_immutable_;
  TVar90._17_7_ = local_b50._17_7_;
  TVar90.id_ = local_b50.id_;
  ctemplate::TemplateDictionary::SetValue(TVar52,TVar90);
  ctemplate::TemplateString::TemplateString(&local_b70,"AE_JS_BAD");
  ctemplate::TemplateString::TemplateString(&local_b90,"your text\'is clever\'thanks");
  TVar53.length_._0_4_ = (int)local_b70.length_;
  TVar53.ptr_ = local_b70.ptr_;
  TVar53.length_._4_4_ = (int)(local_b70.length_ >> 0x20);
  TVar53._16_4_ = local_b70._16_4_;
  TVar53._20_4_ = local_b70._20_4_;
  TVar53.id_._0_4_ = (int)local_b70.id_;
  TVar53.id_._4_4_ = (int)(local_b70.id_ >> 0x20);
  TVar91.length_ = local_b90.length_;
  TVar91.ptr_ = local_b90.ptr_;
  TVar91.is_immutable_ = local_b90.is_immutable_;
  TVar91._17_7_ = local_b90._17_7_;
  TVar91.id_ = local_b90.id_;
  ctemplate::TemplateDictionary::SetValue(TVar53,TVar91);
  ctemplate::TemplateString::TemplateString(&local_bb0,"AE_USERNAME_GOOD");
  ctemplate::TemplateString::TemplateString(&local_bd0,"Mr. Nice");
  TVar54.length_._0_4_ = (int)local_bb0.length_;
  TVar54.ptr_ = local_bb0.ptr_;
  TVar54.length_._4_4_ = (int)(local_bb0.length_ >> 0x20);
  TVar54._16_4_ = local_bb0._16_4_;
  TVar54._20_4_ = local_bb0._20_4_;
  TVar54.id_._0_4_ = (int)local_bb0.id_;
  TVar54.id_._4_4_ = (int)(local_bb0.id_ >> 0x20);
  TVar92.length_ = local_bd0.length_;
  TVar92.ptr_ = local_bd0.ptr_;
  TVar92.is_immutable_ = local_bd0.is_immutable_;
  TVar92._17_7_ = local_bd0._17_7_;
  TVar92.id_ = local_bd0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar54,TVar92);
  ctemplate::TemplateString::TemplateString(&local_bf0,"AE_USERNAME_BAD");
  ctemplate::TemplateString::TemplateString(&local_c10,"Doctor<script>alert(2)</script>Evil");
  TVar55.length_._0_4_ = (int)local_bf0.length_;
  TVar55.ptr_ = local_bf0.ptr_;
  TVar55.length_._4_4_ = (int)(local_bf0.length_ >> 0x20);
  TVar55._16_4_ = local_bf0._16_4_;
  TVar55._20_4_ = local_bf0._20_4_;
  TVar55.id_._0_4_ = (int)local_bf0.id_;
  TVar55.id_._4_4_ = (int)(local_bf0.id_ >> 0x20);
  TVar93.length_ = local_c10.length_;
  TVar93.ptr_ = local_c10.ptr_;
  TVar93.is_immutable_ = local_c10.is_immutable_;
  TVar93._17_7_ = local_c10._17_7_;
  TVar93.id_ = local_c10.id_;
  ctemplate::TemplateDictionary::SetValue(TVar55,TVar93);
  ctemplate::TemplateString::TemplateString(&local_c30,"AE_START_EDGE");
  ctemplate::TemplateString::TemplateString(&local_c50,"left");
  TVar56.length_._0_4_ = (int)local_c30.length_;
  TVar56.ptr_ = local_c30.ptr_;
  TVar56.length_._4_4_ = (int)(local_c30.length_ >> 0x20);
  TVar56._16_4_ = local_c30._16_4_;
  TVar56._20_4_ = local_c30._20_4_;
  TVar56.id_._0_4_ = (int)local_c30.id_;
  TVar56.id_._4_4_ = (int)(local_c30.id_ >> 0x20);
  TVar94.length_ = local_c50.length_;
  TVar94.ptr_ = local_c50.ptr_;
  TVar94.is_immutable_ = local_c50.is_immutable_;
  TVar94._17_7_ = local_c50._17_7_;
  TVar94.id_ = local_c50.id_;
  ctemplate::TemplateDictionary::SetValue(TVar56,TVar94);
  ctemplate::TemplateString::TemplateString(&local_c70,"AE_END_EDGE");
  ctemplate::TemplateString::TemplateString(&local_c90,";:center()$$");
  TVar57.length_._0_4_ = (int)local_c70.length_;
  TVar57.ptr_ = local_c70.ptr_;
  TVar57.length_._4_4_ = (int)(local_c70.length_ >> 0x20);
  TVar57._16_4_ = local_c70._16_4_;
  TVar57._20_4_ = local_c70._20_4_;
  TVar57.id_._0_4_ = (int)local_c70.id_;
  TVar57.id_._4_4_ = (int)(local_c70.id_ >> 0x20);
  TVar95.length_ = local_c90.length_;
  TVar95.ptr_ = local_c90.ptr_;
  TVar95.is_immutable_ = local_c90.is_immutable_;
  TVar95._17_7_ = local_c90._17_7_;
  TVar95.id_ = local_c90.id_;
  ctemplate::TemplateDictionary::SetValue(TVar57,TVar95);
  ctemplate::TemplateString::TemplateString(&local_cb0,"AE_FONT_SIZE_PC");
  ctemplate::TemplateString::TemplateString(&local_cd0,"120%");
  TVar58.length_._0_4_ = (int)local_cb0.length_;
  TVar58.ptr_ = local_cb0.ptr_;
  TVar58.length_._4_4_ = (int)(local_cb0.length_ >> 0x20);
  TVar58._16_4_ = local_cb0._16_4_;
  TVar58._20_4_ = local_cb0._20_4_;
  TVar58.id_._0_4_ = (int)local_cb0.id_;
  TVar58.id_._4_4_ = (int)(local_cb0.id_ >> 0x20);
  TVar96.length_ = local_cd0.length_;
  TVar96.ptr_ = local_cd0.ptr_;
  TVar96.is_immutable_ = local_cd0.is_immutable_;
  TVar96._17_7_ = local_cd0._17_7_;
  TVar96.id_ = local_cd0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar58,TVar96);
  ctemplate::TemplateString::TemplateString(&local_cf0,"AE_FONT_SIZE_PT");
  ctemplate::TemplateString::TemplateString(&local_d10,"12pt");
  TVar59.length_._0_4_ = (int)local_cf0.length_;
  TVar59.ptr_ = local_cf0.ptr_;
  TVar59.length_._4_4_ = (int)(local_cf0.length_ >> 0x20);
  TVar59._16_4_ = local_cf0._16_4_;
  TVar59._20_4_ = local_cf0._20_4_;
  TVar59.id_._0_4_ = (int)local_cf0.id_;
  TVar59.id_._4_4_ = (int)(local_cf0.id_ >> 0x20);
  TVar97.length_ = local_d10.length_;
  TVar97.ptr_ = local_d10.ptr_;
  TVar97.is_immutable_ = local_d10.is_immutable_;
  TVar97._17_7_ = local_d10._17_7_;
  TVar97.id_ = local_d10.id_;
  ctemplate::TemplateDictionary::SetValue(TVar59,TVar97);
  ctemplate::TemplateString::TemplateString(&local_d30,"AE_MAUVE_RGB");
  ctemplate::TemplateString::TemplateString(&local_d50,"#FF7BD5");
  TVar60.length_._0_4_ = (int)local_d30.length_;
  TVar60.ptr_ = local_d30.ptr_;
  TVar60.length_._4_4_ = (int)(local_d30.length_ >> 0x20);
  TVar60._16_4_ = local_d30._16_4_;
  TVar60._20_4_ = local_d30._20_4_;
  TVar60.id_._0_4_ = (int)local_d30.id_;
  TVar60.id_._4_4_ = (int)(local_d30.id_ >> 0x20);
  TVar98.length_ = local_d50.length_;
  TVar98.ptr_ = local_d50.ptr_;
  TVar98.is_immutable_ = local_d50.is_immutable_;
  TVar98._17_7_ = local_d50._17_7_;
  TVar98.id_ = local_d50.id_;
  ctemplate::TemplateDictionary::SetValue(TVar60,TVar98);
  ctemplate::TemplateString::TemplateString(&local_d70,"AE_ITALIC");
  ctemplate::TemplateString::TemplateString((TemplateString *)&footer_dict,"italic");
  TVar61.length_._0_4_ = (int)local_d70.length_;
  TVar61.ptr_ = local_d70.ptr_;
  TVar61.length_._4_4_ = (int)(local_d70.length_ >> 0x20);
  TVar61._16_4_ = local_d70._16_4_;
  TVar61._20_4_ = local_d70._20_4_;
  TVar61.id_._0_4_ = (int)local_d70.id_;
  TVar61.id_._4_4_ = (int)(local_d70.id_ >> 0x20);
  TVar99.length_ = local_d88;
  TVar99.ptr_ = (char *)footer_dict;
  TVar99.is_immutable_ = local_d80;
  TVar99._17_7_ = uStack_d7f;
  TVar99.id_ = local_d78;
  ctemplate::TemplateDictionary::SetValue(TVar61,TVar99);
  ctemplate::TemplateString::TemplateString(&local_db8,"FOOTER");
  TVar62.length_._0_4_ = (int)local_db8.length_;
  TVar62.ptr_ = local_db8.ptr_;
  TVar62.length_._4_4_ = (int)(local_db8.length_ >> 0x20);
  TVar62._16_4_ = local_db8._16_4_;
  TVar62._20_4_ = local_db8._20_4_;
  TVar62.id_._0_4_ = (int)local_db8.id_;
  TVar62.id_._4_4_ = (int)(local_db8.id_ >> 0x20);
  local_d98 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar62);
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&inc_simple,"template_unittest_test_footer.in");
  TVar63.length_._0_4_ = (int)local_dd0;
  TVar63.ptr_ = (char *)inc_simple;
  TVar63.length_._4_4_ = (int)(local_dd0 >> 0x20);
  TVar63._16_4_ = (int)local_dc8;
  TVar63._20_4_ = SUB84(local_dc8,4);
  TVar63.id_._0_4_ = (int)local_dc0;
  TVar63.id_._4_4_ = (int)(local_dc0 >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar63);
  ctemplate::TemplateString::TemplateString(&local_e00,"SIMPLE");
  TVar64.length_._0_4_ = (int)local_e00.length_;
  TVar64.ptr_ = local_e00.ptr_;
  TVar64.length_._4_4_ = (int)(local_e00.length_ >> 0x20);
  TVar64._16_4_ = local_e00._16_4_;
  TVar64._20_4_ = local_e00._20_4_;
  TVar64.id_._0_4_ = (int)local_e00.id_;
  TVar64.id_._4_4_ = (int)(local_e00.id_ >> 0x20);
  local_de0 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar64);
  ctemplate::TemplateString::TemplateString(&local_e20,"template_unittest_test_simple.in");
  TVar65.length_._0_4_ = (int)local_e20.length_;
  TVar65.ptr_ = local_e20.ptr_;
  TVar65.length_._4_4_ = (int)(local_e20.length_ >> 0x20);
  TVar65._16_4_ = local_e20._16_4_;
  TVar65._20_4_ = local_e20._20_4_;
  TVar65.id_._0_4_ = (int)local_e20.id_;
  TVar65.id_._4_4_ = (int)(local_e20.id_ >> 0x20);
  ctemplate::TemplateDictionary::SetFilename(TVar65);
  return local_10;
}

Assistant:

static TemplateDictionary* MakeDict1() {
  TemplateDictionary* dict = new TemplateDictionary("dict1", NULL);
  dict->SetFilename("just used for debugging, so doesn't matter.txt");

  // --- These are used by template_unittest_test_simple.in
  dict->SetValue("HEAD", "   This is the head   ");
  // We leave BODY undefined, to make sure that expansion works properly.

  // --- These are used by template_unittest_test_footer.in
  TemplateDictionary* fbt = dict->AddSectionDictionary("FOOTER_BAR_TEXT");
  fbt->SetValue("BODY", "Should never be shown");  // this is part of simple
  fbt->SetEscapedValue("HOME_LINK", "<b>Time to go home!</b>",
                       GOOGLE_NAMESPACE::html_escape);
  // Note: you should never have code like this in real life!  The <b>
  // and </b> should be part of the template proper.
  fbt->SetFormattedValue("ADVERTISE_LINK", "<b>Be advertiser #%d</b>", 2);
  fbt->SetValue("ABOUT_GOOGLE_LINK", "<A HREF=/>About Google!</A>");

  // We show PROMO_LICENSING_SECTION in the main dict, even though
  // it's defined in the fbt subsection.  This will still work: section
  // showing goes to the parent dict if not found in the current dict.
  dict->ShowSection("PROMO_LICENSING_SECTION");
  dict->SetValue("PROMO_LICENSING_LINK", "<A HREF='foo'>");

  // We don't show the TRIM_LINE section, so these vars shouldn't be seen
  dict->SetValue("TRIM_LINE_COLOR", "Who cares?");
  dict->SetIntValue("TRIM_LINE_HEIGHT", 10);

  dict->SetIntValue("MODIFIED_BY_GOOGLE", 2005);
  dict->SetValue("MSG_copyright", "&copy; Google Inc. (all rights reserved)");
  // We don't set ODP_ATTRIBUTION, so this include is ignored.

  dict->ShowSection("CLOSING_DIV_SECTION");

  // We won't set any of the includes that follow, just to keep things simple

  // First, call SetValueAndShowSection on a non-existence section, should noop
  dict->SetValueAndShowSection("LATENCY_PREFETCH_URL", "/huh?",
                               "UNUSED_SECTION_NAME");
  // Now try the real URL
  dict->SetValueAndShowSection("LATENCY_PREFETCH_URL", string("/latency"),
                               "LATENCY_PREFETCH");

  // JAVASCRIPT_FOOTER_SECTION was meant to be either shown or hidden, but
  // hey, let's try showing it several times, each with a different include.
  // And let's include each one several times.
  TemplateDictionary* jfs1 = dict->AddSectionDictionary(
      "JAVASCRIPT_FOOTER_SECTION");
  // This first dictionary should have an empty HEAD and BODY
  TemplateDictionary* inc1a = jfs1->AddIncludeDictionary("FAST_NEXT_JAVASCRIPT");
  inc1a->SetFilename("template_unittest_test_simple.in");
  // For the second dict, let's set an illegal filename: should be ignored
  TemplateDictionary* inc1b = jfs1->AddIncludeDictionary("FAST_NEXT_JAVASCRIPT");
  inc1b->SetFilename(INVALID1_FN);
  // For the third dict, let's do the same as the first, but with a HEAD
  TemplateDictionary* inc1c = jfs1->AddIncludeDictionary("FAST_NEXT_JAVASCRIPT");
  inc1c->SetFilename("template_unittest_test_simple.in");
  inc1c->SetValue("HEAD", "head");

  // Let's expand the section again with two different includes, and again a
  // third template not meant to be expanded (in this case, don't set filename)
  TemplateDictionary* jfs2 = dict->AddSectionDictionary(
      "JAVASCRIPT_FOOTER_SECTION");
  TemplateDictionary* inc2a = jfs2->AddIncludeDictionary("FAST_NEXT_JAVASCRIPT");
  inc2a->SetFilename("template_unittest_test_simple.in");
  inc2a->SetValue("HEAD", "include-head");
  inc2a->SetEscapedFormattedValue("BODY", GOOGLE_NAMESPACE::html_escape,
                                  "<b>%s</b>: %.4f", "<A HREF=/>", 1.0/3);
  inc2a->SetValue("BI_NEWLINE", "");   // override the global default
  TemplateDictionary* inc2b = jfs2->AddIncludeDictionary("FAST_NEXT_JAVASCRIPT");
  inc2b->SetFilename("template_unittest_test_html.in");
  inc2b->SetValue("HEAD", "should be ignored");
  jfs2->AddIncludeDictionary("FAST_NEXT_JAVASCRIPT");   // ignored: no filename

  // --- These are used by template_unittest_test_html.in

  // This should returns in NO_MOUSEOVER_FUNCTIONS remaining hidden
  dict->SetValueAndShowSection("DUMMY", "", "NO_MOUSEOVER_FUNCTIONS");

  dict->ShowSection("MOUSEOVER_FUNCTIONS");
  TemplateDictionary* foo = dict->AddIncludeDictionary("MOUSEOVER_JAVASCRIPT");
  foo->SetFilename(string("not_a_template"));
  foo->SetValue("BI_NEWLINE", "not gonna matter");

  dict->SetEscapedValue("GOTO_MESSAGE", "print \"Go home\"",
                        GOOGLE_NAMESPACE::javascript_escape);

  dict->SetEscapedValue("UPDATE", "monday & tuesday",
                                      GOOGLE_NAMESPACE::html_escape);
  dict->ShowSection("UPDATE_SECTION");

  dict->SetValue("ALIGNMENT", "\"right\"");   // all results sections see this
  for (int i = 0; i < 3; ++i) {   // we'll do three results
    TemplateDictionary* result = dict->AddSectionDictionary("RESULTS");
    if (i % 2 == 0)
      result->ShowSection("WHITE_BG");  // gives us striped results!
    const char* res = "<&>\"result\" #%d'&'";
    result->SetFormattedValue("RESULT", res, i);
    result->SetEscapedFormattedValue("XML_RESULT",
                                     GOOGLE_NAMESPACE::xml_escape,
                                     res, i);
    result->SetIntValue("GOODNESS", i + 5);
  }

  // For testing auto-escape.
  dict->SetValue("AE_TITLE_GOOD", "Hello World!");
  dict->SetValue("AE_TITLE_BAD", "Hello <script>alert(1)</script> World!");
  dict->SetValue("AE_URL_GOOD", "http://www.google.com/");
  dict->SetValue("AE_URL_BAD", "javascript:alert(1)");
  dict->SetValue("AE_BG_COLOR_GOOD", "red");
  dict->SetValue("AE_BG_COLOR_BAD", "evil! &");
  dict->SetValue("AE_JS_GOOD", "your text here");
  dict->SetValue("AE_JS_BAD", "your text'is clever'thanks");
  dict->SetValue("AE_USERNAME_GOOD", "Mr. Nice");
  dict->SetValue("AE_USERNAME_BAD", "Doctor<script>alert(2)</script>Evil");
  dict->SetValue("AE_START_EDGE", "left");
  dict->SetValue("AE_END_EDGE", ";:center()$$");  // Some invalid chars.
  dict->SetValue("AE_FONT_SIZE_PC", "120%");
  dict->SetValue("AE_FONT_SIZE_PT", "12pt");
  dict->SetValue("AE_MAUVE_RGB", "#FF7BD5");
  dict->SetValue("AE_ITALIC", "italic");

  // This won't see any of the vars *we* set
  TemplateDictionary* footer_dict = dict->AddIncludeDictionary("FOOTER");
  footer_dict->SetFilename("template_unittest_test_footer.in");

  // --- These are used by template_unittest_test_modifiers.in

  // UPDATE and UPDATE_SECTION we inherit from test_html.in
  TemplateDictionary* inc_simple = dict->AddIncludeDictionary("SIMPLE");
  inc_simple->SetFilename("template_unittest_test_simple.in");

  return dict;
}